

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void * stb_realloc(void *ptr,size_t newsize)

{
  stb__alloc_type sVar1;
  undefined8 *puVar2;
  void ***pppvVar3;
  void **ppvVar4;
  stb__nochildren *s_1;
  stb__alloc *s;
  stb__alloc_type t;
  size_t newsize_local;
  void *ptr_local;
  
  if (ptr == (void *)0x0) {
    ptr_local = stb_malloc((void *)0x0,newsize);
  }
  else if (newsize == 0) {
    stb_free(ptr);
    ptr_local = (void *)0x0;
  }
  else {
    sVar1 = stb__identify(ptr);
    if ((sVar1 != STB__alloc) && (sVar1 != STB__nochildren)) {
      __assert_fail("t == STB__alloc || t == STB__nochildren",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0xb58,"void *stb_realloc(void *, size_t)");
    }
    if (sVar1 == STB__alloc) {
      puVar2 = (undefined8 *)realloc((void *)((long)ptr + -0x20),newsize + 0x20);
      if (puVar2 == (undefined8 *)0x0) {
        ptr_local = (void *)0x0;
      }
      else {
        ptr_local = puVar2 + 4;
        *(void **)*puVar2 = ptr_local;
        if (puVar2[2] != 0) {
          pppvVar3 = stb__prevn((void *)puVar2[2]);
          *pppvVar3 = (void **)(puVar2 + 2);
        }
        if (puVar2[1] != 0) {
          pppvVar3 = stb__prevn((void *)puVar2[1]);
          *pppvVar3 = (void **)(puVar2 + 1);
        }
      }
    }
    else {
      ppvVar4 = (void **)realloc(ptr,newsize + 8);
      if (ppvVar4 == (void **)0x0) {
        ptr_local = (void *)0x0;
      }
      else {
        *(void ***)ppvVar4[1] = ppvVar4 + 2;
        if (*ppvVar4 != (void *)0x0) {
          pppvVar3 = stb__prevn(*ppvVar4);
          *pppvVar3 = ppvVar4;
        }
        ptr_local = ppvVar4 + 2;
      }
    }
  }
  return ptr_local;
}

Assistant:

void *stb_realloc(void *ptr, size_t newsize)
{
   stb__alloc_type t;

   if (ptr == NULL) return stb_malloc(NULL, newsize);
   if (newsize == 0) { stb_free(ptr); return NULL; }
   
   t = stb__identify(ptr);
   assert(t == STB__alloc || t == STB__nochildren);

   if (t == STB__alloc) {
      stb__alloc *s = (stb__alloc *) ptr - 1;

      s = (stb__alloc *) realloc(s, newsize + sizeof(*s));
      if (s == NULL) return NULL;

      ptr = s+1;

      // update pointers
      (*s->prevn) = ptr;
      if (s->next)
         *stb__prevn(s->next) = &s->next;

      if (s->child)
         *stb__prevn(s->child) = &s->child;

      return ptr;
   } else {
      stb__nochildren *s = (stb__nochildren *) ptr - 1;

      s = (stb__nochildren *) realloc(ptr, newsize + sizeof(s));
      if (s == NULL) return NULL;

      // update pointers
      (*s->prevn) = s+1;
      if (s->next)
         *stb__prevn(s->next) = &s->next;

      return s+1;
   }
}